

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmCommandExists(void *arg,char *name)

{
  cmState *this;
  cmCommand *pcVar1;
  allocator<char> local_39;
  string local_38;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  pcVar1 = cmState::GetCommand(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (int)(pcVar1 != (cmCommand *)0x0);
}

Assistant:

int CCONV cmCommandExists(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->GetState()->GetCommand(name) ? 1 : 0);
}